

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

jpeg_scan_info * fill_dc_scans(jpeg_scan_info *scanptr,int ncomps,int Ah,int Al)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  jpeg_scan_info *in_RDI;
  int ci;
  int local_18;
  jpeg_scan_info *local_8;
  
  if (in_ESI < 5) {
    in_RDI->comps_in_scan = in_ESI;
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      in_RDI->component_index[local_18] = local_18;
    }
    in_RDI->Se = 0;
    in_RDI->Ss = 0;
    in_RDI->Ah = in_EDX;
    in_RDI->Al = in_ECX;
    local_8 = in_RDI + 1;
  }
  else {
    local_8 = fill_scans(in_RDI,in_ESI,0,0,in_EDX,in_ECX);
  }
  return local_8;
}

Assistant:

LOCAL(jpeg_scan_info *)
fill_dc_scans(jpeg_scan_info *scanptr, int ncomps, int Ah, int Al)
/* Support routine: generate interleaved DC scan if possible, else N scans */
{
  int ci;

  if (ncomps <= MAX_COMPS_IN_SCAN) {
    /* Single interleaved DC scan */
    scanptr->comps_in_scan = ncomps;
    for (ci = 0; ci < ncomps; ci++)
      scanptr->component_index[ci] = ci;
    scanptr->Ss = scanptr->Se = 0;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    scanptr++;
  } else {
    /* Noninterleaved DC scan for each component */
    scanptr = fill_scans(scanptr, ncomps, 0, 0, Ah, Al);
  }
  return scanptr;
}